

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

void Abc_NodeSopToCubes(Abc_Obj_t *pNodeOld,Abc_Ntk_t *pNtkNew,int fXor)

{
  char *pSop_00;
  Mem_Flex_t *pMVar1;
  int iVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  Abc_Obj_t *pAVar7;
  bool bVar8;
  int local_58;
  int nFanins;
  int nVars;
  int Value;
  int v;
  char *pSop;
  char *pCube;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNodeNew;
  Abc_Obj_t *pNodeOr;
  int fXor_local;
  Abc_Ntk_t *pNtkNew_local;
  Abc_Obj_t *pNodeOld_local;
  
  pSop_00 = (char *)(pNodeOld->field_5).pData;
  iVar2 = Abc_ObjFaninNum(pNodeOld);
  iVar3 = Abc_SopGetCubeNum(pSop_00);
  if (iVar3 < 2) {
    pAVar4 = Abc_NtkDupObj(pNtkNew,pNodeOld,0);
    for (nVars = 0; iVar2 = Abc_ObjFaninNum(pNodeOld), nVars < iVar2; nVars = nVars + 1) {
      pAVar5 = Abc_ObjFanin(pNodeOld,nVars);
      Abc_ObjAddFanin(pAVar4,(pAVar5->field_6).pCopy);
    }
    if ((Abc_Obj_t *)(pNodeOld->field_6).pTemp != pAVar4) {
      __assert_fail("pNodeOld->pCopy == pNodeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                    ,0x9ee,"void Abc_NodeSopToCubes(Abc_Obj_t *, Abc_Ntk_t *, int)");
    }
  }
  else {
    pAVar4 = Abc_NtkCreateNode(pNtkNew);
    pSop = pSop_00;
    if (fXor == 0) {
      pMVar1 = (Mem_Flex_t *)pNtkNew->pManFunc;
      iVar3 = Abc_SopGetCubeNum(pSop_00);
      pcVar6 = Abc_SopCreateOr(pMVar1,iVar3,(int *)0x0);
      (pAVar4->field_5).pData = pcVar6;
    }
    else {
      pMVar1 = (Mem_Flex_t *)pNtkNew->pManFunc;
      iVar3 = Abc_SopGetCubeNum(pSop_00);
      pcVar6 = Abc_SopCreateXorSpecial(pMVar1,iVar3);
      (pAVar4->field_5).pData = pcVar6;
    }
    for (; *pSop != '\0'; pSop = pSop + (iVar2 + 3)) {
      local_58 = 0;
      nVars = 0;
      while( true ) {
        bVar8 = false;
        if (pSop[nVars] != ' ') {
          nFanins = (int)pSop[nVars];
          bVar8 = nFanins != 0;
        }
        if (!bVar8) break;
        if ((nFanins == 0x30) || (nFanins == 0x31)) {
          local_58 = local_58 + 1;
        }
        nVars = nVars + 1;
      }
      if (local_58 == 0) {
        pAVar5 = Abc_NtkCreateNodeConst1(pNtkNew);
        Abc_ObjAddFanin(pAVar4,pAVar5);
      }
      else {
        if (local_58 < 1) {
          __assert_fail("nFanins > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                        ,0xa04,"void Abc_NodeSopToCubes(Abc_Obj_t *, Abc_Ntk_t *, int)");
        }
        pAVar5 = Abc_NtkCreateNode(pNtkNew);
        pcVar6 = Abc_SopCreateAnd((Mem_Flex_t *)pNtkNew->pManFunc,local_58,(int *)0x0);
        (pAVar5->field_5).pData = pcVar6;
        local_58 = 0;
        nVars = 0;
        while( true ) {
          bVar8 = false;
          if (pSop[nVars] != ' ') {
            nFanins = (int)pSop[nVars];
            bVar8 = nFanins != 0;
          }
          if (!bVar8) break;
          if ((nFanins == 0x30) || (nFanins == 0x31)) {
            pAVar7 = Abc_ObjFanin(pNodeOld,nVars);
            Abc_ObjAddFanin(pAVar5,(pAVar7->field_6).pCopy);
            if (nFanins == 0x30) {
              Abc_SopComplementVar((char *)(pAVar5->field_5).pData,local_58);
            }
            local_58 = local_58 + 1;
          }
          nVars = nVars + 1;
        }
        Abc_ObjAddFanin(pAVar4,pAVar5);
      }
    }
    iVar2 = Abc_SopIsComplement(pSop_00);
    if (iVar2 != 0) {
      Abc_SopComplement((char *)(pAVar4->field_5).pData);
    }
    if ((pNodeOld->field_6).pTemp != (void *)0x0) {
      __assert_fail("pNodeOld->pCopy == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                    ,0xa18,"void Abc_NodeSopToCubes(Abc_Obj_t *, Abc_Ntk_t *, int)");
    }
    (pNodeOld->field_6).pCopy = pAVar4;
  }
  return;
}

Assistant:

void Abc_NodeSopToCubes( Abc_Obj_t * pNodeOld, Abc_Ntk_t * pNtkNew, int fXor )
{
    Abc_Obj_t * pNodeOr, * pNodeNew, * pFanin;
    char * pCube, * pSop = (char *)pNodeOld->pData;
    int v, Value, nVars = Abc_ObjFaninNum(pNodeOld), nFanins;
    // create the root node
    if ( Abc_SopGetCubeNum(pSop) < 2 )
    {
        pNodeNew = Abc_NtkDupObj( pNtkNew, pNodeOld, 0 );
        Abc_ObjForEachFanin( pNodeOld, pFanin, v )
            Abc_ObjAddFanin( pNodeNew, pFanin->pCopy );
        assert( pNodeOld->pCopy == pNodeNew );
        return;
    }
    // add the OR gate
    pNodeOr = Abc_NtkCreateNode( pNtkNew );
    if ( fXor )
        pNodeOr->pData = Abc_SopCreateXorSpecial( (Mem_Flex_t *)pNtkNew->pManFunc, Abc_SopGetCubeNum(pSop) );
    else 
        pNodeOr->pData = Abc_SopCreateOr( (Mem_Flex_t *)pNtkNew->pManFunc, Abc_SopGetCubeNum(pSop), NULL );
    // check the logic function of the node
    Abc_SopForEachCube( pSop, nVars, pCube )
    {
        nFanins = 0;
        Abc_CubeForEachVar( pCube, Value, v )
            if ( Value == '0' || Value == '1' )
                nFanins++;
        if ( nFanins == 0 ) // const1 cube in ESOP
        {
            pNodeNew = Abc_NtkCreateNodeConst1( pNtkNew );
            Abc_ObjAddFanin( pNodeOr, pNodeNew );
            continue;
        }
        assert( nFanins > 0 );
        // create node
        pNodeNew = Abc_NtkCreateNode( pNtkNew );
        pNodeNew->pData = Abc_SopCreateAnd( (Mem_Flex_t *)pNtkNew->pManFunc, nFanins, NULL );
        nFanins = 0;
        Abc_CubeForEachVar( pCube, Value, v )
        {
            if ( Value != '0' && Value != '1' )
                continue;
            Abc_ObjAddFanin( pNodeNew, Abc_ObjFanin(pNodeOld, v)->pCopy );
            if ( Value == '0' )
                Abc_SopComplementVar( (char *)pNodeNew->pData, nFanins );
            nFanins++;
        }
        Abc_ObjAddFanin( pNodeOr, pNodeNew );
    }
    // check the complement
    if ( Abc_SopIsComplement(pSop) )
        Abc_SopComplement( (char *)pNodeOr->pData );
    // mark the old node with the new one
    assert( pNodeOld->pCopy == NULL );
    pNodeOld->pCopy = pNodeOr;
}